

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calendar.cpp
# Opt level: O2

double __thiscall icu_63::Calendar::getTimeInMillis(Calendar *this,UErrorCode *status)

{
  if (U_ZERO_ERROR < *status) {
    return 0.0;
  }
  if ((this->fIsTimeSet == '\0') && (updateTime(this,status), U_ZERO_ERROR < *status)) {
    return 0.0;
  }
  return this->fTime;
}

Assistant:

double
Calendar::getTimeInMillis(UErrorCode& status) const
{
    if(U_FAILURE(status))
        return 0.0;

    if ( ! fIsTimeSet)
        ((Calendar*)this)->updateTime(status);

    /* Test for buffer overflows */
    if(U_FAILURE(status)) {
        return 0.0;
    }
    return fTime;
}